

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::ApproxQuantileState,int,duckdb::ApproxQuantileScalarOperation>
               (int *idata,AggregateInputData *aggr_input_data,ApproxQuantileState *state,
               idx_t count,ValidityMask *mask)

{
  TemplatedValidityMask<unsigned_long> *pTVar1;
  bool bVar2;
  ApproxQuantileState *state_00;
  AggregateUnaryInput *unary_input;
  unsigned_long in_RCX;
  AggregateInputData *in_RSI;
  ValidityMask *in_R8;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t *base_idx;
  AggregateUnaryInput input;
  idx_t local_78;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  TemplatedValidityMask<unsigned_long> *pTVar3;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff98;
  ApproxQuantileState *input_00;
  AggregateUnaryInput local_40;
  unsigned_long local_20;
  
  local_20 = in_RCX;
  AggregateUnaryInput::AggregateUnaryInput(&local_40,in_RSI,in_R8);
  local_40.input_idx = 0;
  state_00 = (ApproxQuantileState *)TemplatedValidityMask<unsigned_long>::EntryCount(0x1ce0695);
  for (input_00 = (ApproxQuantileState *)0x0; input_00 < state_00;
      input_00 = (ApproxQuantileState *)((long)&input_00->h + 1)) {
    unary_input = (AggregateUnaryInput *)
                  TemplatedValidityMask<unsigned_long>::GetValidityEntry
                            (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff98 =
         (TemplatedValidityMask<unsigned_long> *)
         MinValue<unsigned_long>((unsigned_long)(local_40.input_idx + 0x40),local_20);
    bVar2 = ApproxQuantileOperation::IgnoreNull();
    if ((!bVar2) ||
       (bVar2 = TemplatedValidityMask<unsigned_long>::AllValid((unsigned_long)unary_input), bVar2))
    {
      for (; pTVar1 = (TemplatedValidityMask<unsigned_long> *)local_40.input_idx,
          local_40.input_idx < in_stack_ffffffffffffff98;
          local_40.input_idx = (long)(unsigned_long **)local_40.input_idx + 1) {
        ApproxQuantileOperation::
        Operation<int,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                  (state_00,(int *)input_00,unary_input);
      }
    }
    else {
      bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid((unsigned_long)unary_input);
      pTVar3 = (TemplatedValidityMask<unsigned_long> *)local_40.input_idx;
      pTVar1 = in_stack_ffffffffffffff98;
      if (!bVar2) {
        for (; in_stack_ffffffffffffff90 = pTVar3,
            pTVar1 = (TemplatedValidityMask<unsigned_long> *)local_40.input_idx,
            local_40.input_idx < in_stack_ffffffffffffff98;
            local_40.input_idx = (long)(unsigned_long **)local_40.input_idx + 1) {
          local_78 = local_40.input_idx - (long)pTVar3;
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((unsigned_long *)&stack0xffffffffffffffa0,&local_78);
          if (bVar2) {
            ApproxQuantileOperation::
            Operation<int,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
                      (state_00,(int *)input_00,unary_input);
          }
        }
      }
    }
    local_40.input_idx = (idx_t)pTVar1;
  }
  return;
}

Assistant:

static inline void UnaryFlatUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                       STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask) {
		AggregateUnaryInput input(aggr_input_data, mask);
		auto &base_idx = input.input_idx;
		base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (!OP::IgnoreNull() || ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
					}
				}
			}
		}
	}